

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

void add192(uint64_t a0,uint64_t a1,uint64_t a2,uint64_t b0,uint64_t b1,uint64_t b2,uint64_t *z0Ptr,
           uint64_t *z1Ptr,uint64_t *z2Ptr)

{
  ulong uVar1;
  ulong uVar2;
  int8_t carry1;
  int8_t carry0;
  uint64_t z2;
  uint64_t z1;
  uint64_t z0;
  uint64_t b2_local;
  uint64_t b1_local;
  uint64_t b0_local;
  uint64_t a2_local;
  uint64_t a1_local;
  uint64_t a0_local;
  
  uVar1 = a2 + b2;
  uVar2 = (long)(uVar1 < a2) + a1 + b1;
  *z2Ptr = uVar1;
  *z1Ptr = uVar2;
  *z0Ptr = (long)(a1 + b1 < a1) + (long)(int)(uint)(uVar2 < (ulong)(long)(uVar1 < a2)) + a0 + b0;
  return;
}

Assistant:

static inline void
 add192(
     uint64_t a0,
     uint64_t a1,
     uint64_t a2,
     uint64_t b0,
     uint64_t b1,
     uint64_t b2,
     uint64_t *z0Ptr,
     uint64_t *z1Ptr,
     uint64_t *z2Ptr
 )
{
    uint64_t z0, z1, z2;
    int8_t carry0, carry1;

    z2 = a2 + b2;
    carry1 = ( z2 < a2 );
    z1 = a1 + b1;
    carry0 = ( z1 < a1 );
    z0 = a0 + b0;
    z1 += carry1;
    z0 += ( z1 < carry1 );
    z0 += carry0;
    *z2Ptr = z2;
    *z1Ptr = z1;
    *z0Ptr = z0;

}